

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O0

bool __thiscall
ec::base_protobuf::
out_varint<unsigned_long,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
          (base_protobuf *this,unsigned_long v,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *pout)

{
  byte __c;
  int iVar1;
  byte bVar2;
  undefined4 local_2c;
  uint8_t out;
  int nbit;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *pout_local;
  unsigned_long v_local;
  base_protobuf *this_local;
  
  local_2c = 0;
  do {
    __c = (byte)(v >> ((byte)local_2c & 0x3f)) & 0x7f;
    bVar2 = (byte)(local_2c + 7);
    if (v >> (bVar2 & 0x3f) == 0) {
      std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      push_back(pout,__c);
      break;
    }
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    push_back(pout,__c | 0x80);
    iVar1 = local_2c + 0xe;
    local_2c = local_2c + 7;
  } while (iVar1 < 0x40);
  if (v >> (bVar2 & 0x3f) != 0) {
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    push_back(pout,(uchar)(v >> (bVar2 & 0x3f)));
  }
  return true;
}

Assistant:

bool out_varint(_Tp v, _Out *pout) //out Varint (Base 128 Varints)
    {
        int nbit = 0;
        uint8_t out = 0;

        do {
            out = (v >> nbit) & 0x7F;
            nbit += 7;

            if (v >> nbit) {
                out |= 0x80;
                pout->push_back(out);
            } else {
                pout->push_back(out);
                break;
            }
        } while (nbit + 7 < ((int)sizeof(_Tp) * 8));

        if (v >> nbit) {
            try {
                pout->push_back((uint8_t)(v >> nbit));
            } catch (...) {
                _lasterr = pberr_memory;
                return false;
            }
        }

        return true;
    }